

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqtable.cpp
# Opt level: O0

bool __thiscall SQTable::NewSlot(SQTable *this,SQObjectPtr *key,SQObjectPtr *val)

{
  SQHash SVar1;
  ulong hash;
  _HashNode *p_Var2;
  _HashNode *local_50;
  _HashNode *othern;
  SQHash mph;
  _HashNode *mp;
  _HashNode *n;
  SQHash h;
  SQObjectPtr *val_local;
  SQObjectPtr *key_local;
  SQTable *this_local;
  
  if ((key->super_SQObject)._type == OT_NULL) {
    __assert_fail("type(key) != OT_NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqtable.cpp"
                  ,0x79,"bool SQTable::NewSlot(const SQObjectPtr &, const SQObjectPtr &)");
  }
  SVar1 = HashObj(key);
  hash = SVar1 & this->_numofnodes - 1U;
  p_Var2 = _Get(this,key,hash);
  if (p_Var2 == (_HashNode *)0x0) {
    p_Var2 = this->_nodes + hash;
    mph = (SQHash)p_Var2;
    if ((p_Var2->key).super_SQObject._type != OT_NULL) {
      mph = (SQHash)this->_firstfree;
      SVar1 = HashObj(&p_Var2->key);
      if ((mph < p_Var2) &&
         (local_50 = this->_nodes + (SVar1 & this->_numofnodes - 1U), local_50 != p_Var2)) {
        for (; local_50->next != p_Var2; local_50 = local_50->next) {
          if (local_50->next == (_HashNode *)0x0) {
            __assert_fail("othern->next != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqtable.cpp"
                          ,0x8f,"bool SQTable::NewSlot(const SQObjectPtr &, const SQObjectPtr &)");
          }
        }
        local_50->next = (_HashNode *)mph;
        ::SQObjectPtr::operator=(&((_HashNode *)mph)->key,&p_Var2->key);
        ::SQObjectPtr::operator=((SQObjectPtr *)mph,&p_Var2->val);
        ((_HashNode *)mph)->next = p_Var2->next;
        ::SQObjectPtr::Null(&p_Var2->key);
        ::SQObjectPtr::Null(&p_Var2->val);
        p_Var2->next = (_HashNode *)0x0;
        mph = (SQHash)p_Var2;
      }
      else {
        ((_HashNode *)mph)->next = p_Var2->next;
        p_Var2->next = (_HashNode *)mph;
      }
    }
    ::SQObjectPtr::operator=((SQObjectPtr *)(mph + 0x10),key);
    while( true ) {
      if (((this->_firstfree->key).super_SQObject._type == OT_NULL) &&
         (this->_firstfree->next == (_HashNode *)0x0)) {
        ::SQObjectPtr::operator=((SQObjectPtr *)mph,val);
        this->_usednodes = this->_usednodes + 1;
        return true;
      }
      if (this->_firstfree == this->_nodes) break;
      this->_firstfree = this->_firstfree + -1;
    }
    Rehash(this,true);
    this_local._7_1_ = NewSlot(this,key,val);
  }
  else {
    ::SQObjectPtr::operator=(&p_Var2->val,val);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SQTable::NewSlot(const SQObjectPtr &key,const SQObjectPtr &val)
{
    assert(type(key) != OT_NULL);
    SQHash h = HashObj(key) & (_numofnodes - 1);
    _HashNode *n = _Get(key, h);
    if (n) {
        n->val = val;
        return false;
    }
    _HashNode *mp = &_nodes[h];
    n = mp;


    //key not found I'll insert it
    //main pos is not free

    if(type(mp->key) != OT_NULL) {
        n = _firstfree;  /* get a free place */
        SQHash mph = HashObj(mp->key) & (_numofnodes - 1);
        _HashNode *othern;  /* main position of colliding node */

        if (mp > n && (othern = &_nodes[mph]) != mp){
            /* yes; move colliding node into free position */
            while (othern->next != mp){
                assert(othern->next != NULL);
                othern = othern->next;  /* find previous */
            }
            othern->next = n;  /* redo the chain with `n' in place of `mp' */
            n->key = mp->key;
            n->val = mp->val;/* copy colliding node into free pos. (mp->next also goes) */
            n->next = mp->next;
            mp->key.Null();
            mp->val.Null();
            mp->next = NULL;  /* now `mp' is free */
        }
        else{
            /* new node will go into free position */
            n->next = mp->next;  /* chain new position */
            mp->next = n;
            mp = n;
        }
    }
    mp->key = key;

    for (;;) {  /* correct `firstfree' */
        if (type(_firstfree->key) == OT_NULL && _firstfree->next == NULL) {
            mp->val = val;
            _usednodes++;
            return true;  /* OK; table still has a free place */
        }
        else if (_firstfree == _nodes) break;  /* cannot decrement from here */
        else (_firstfree)--;
    }
    Rehash(true);
    return NewSlot(key, val);
}